

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_nim_is_valid(nifti_image *nim,int complain)

{
  bool bVar1;
  int iVar2;
  int errs;
  int complain_local;
  nifti_image *nim_local;
  
  bVar1 = false;
  if (nim == (nifti_image *)0x0) {
    fprintf(_stderr,"** is_valid_nim: nim is NULL\n");
    nim_local._4_4_ = 0;
  }
  else {
    if (2 < g_opts.debug) {
      fprintf(_stderr,"-d nim_is_valid check...\n");
    }
    iVar2 = nifti_nim_has_valid_dims(nim,complain);
    if (iVar2 == 0) {
      if (complain == 0) {
        return 0;
      }
      bVar1 = true;
    }
    if (bVar1) {
      nim_local._4_4_ = 0;
    }
    else {
      nim_local._4_4_ = 1;
    }
  }
  return nim_local._4_4_;
}

Assistant:

int nifti_nim_is_valid(nifti_image * nim, int complain)
{
   int errs = 0;

   if( !nim ){
      fprintf(stderr,"** is_valid_nim: nim is NULL\n");
      return 0;
   }

   if( g_opts.debug > 2 ) fprintf(stderr,"-d nim_is_valid check...\n");

   /**- check that dim[] matches the individual values ndim, nx, ny, ... */
   if( ! nifti_nim_has_valid_dims(nim,complain) ){
      if( !complain ) return 0;
      errs++;
   }

   /* might check nbyper, pixdim, q/sforms, swapsize, nifti_type, ... */

   /**- be explicit in return of 0 or 1 */
   if( errs > 0 ) return 0;
   else           return 1;
}